

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
std::pair<cs_impl::any,_cs_impl::any>::pair
          (pair<cs_impl::any,_cs_impl::any> *this,pair<cs_impl::any,_cs_impl::any> *param_2)

{
  proxy *ppVar1;
  
  ppVar1 = (param_2->first).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (this->first).mDat = ppVar1;
  ppVar1 = (param_2->second).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (this->second).mDat = ppVar1;
  return;
}

Assistant:

proxy *duplicate() const noexcept
		{
			if (mDat != nullptr) {
				++mDat->refcount;
			}
			return mDat;
		}